

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TOperator __thiscall glslang::TIntermediate::mapTypeToConstructorOp(TIntermediate *this,TType *type)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TOperator local_24;
  TOperator op;
  TType *type_local;
  TIntermediate *this_local;
  
  local_24 = EOpNull;
  iVar2 = (*type->_vptr_TType[0xb])();
  bVar1 = TQualifier::isNonUniform((TQualifier *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    this_local._4_4_ = EOpConstructNonuniform;
  }
  else {
    bVar1 = TType::isCoopMatNV(type);
    if (bVar1) {
      this_local._4_4_ = EOpConstructCooperativeMatrixNV;
    }
    else {
      bVar1 = TType::isCoopMatKHR(type);
      if (bVar1) {
        this_local._4_4_ = EOpConstructCooperativeMatrixKHR;
      }
      else {
        bVar1 = TType::isCoopVecNV(type);
        if (bVar1) {
          this_local._4_4_ = EOpConstructCooperativeVectorNV;
        }
        else {
          iVar2 = (*type->_vptr_TType[7])();
          switch(iVar2) {
          case 1:
            uVar3 = (*type->_vptr_TType[0x1c])();
            if ((uVar3 & 1) == 0) {
              iVar2 = (*type->_vptr_TType[0xc])();
              switch(iVar2) {
              case 1:
                local_24 = EOpConstructFloat;
                break;
              case 2:
                local_24 = EOpConstructVec2;
                break;
              case 3:
                local_24 = EOpConstructVec3;
                break;
              case 4:
                local_24 = EOpConstructVec4;
              }
            }
            else {
              iVar2 = (*type->_vptr_TType[0xd])();
              if (iVar2 == 2) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructMat2x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructMat2x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructMat2x4;
                }
              }
              else if (iVar2 == 3) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructMat3x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructMat3x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructMat3x4;
                }
              }
              else if (iVar2 == 4) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructMat4x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructMat4x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructMat4x4;
                }
              }
            }
            break;
          case 2:
            iVar2 = (*type->_vptr_TType[0xd])();
            if (iVar2 == 0) {
              iVar2 = (*type->_vptr_TType[0xc])();
              switch(iVar2) {
              case 1:
                local_24 = EOpConstructDouble;
                break;
              case 2:
                local_24 = EOpConstructDVec2;
                break;
              case 3:
                local_24 = EOpConstructDVec3;
                break;
              case 4:
                local_24 = EOpConstructDVec4;
              }
            }
            else {
              iVar2 = (*type->_vptr_TType[0xd])();
              if (iVar2 == 2) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructDMat2x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructDMat2x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructDMat2x4;
                }
              }
              else if (iVar2 == 3) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructDMat3x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructDMat3x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructDMat3x4;
                }
              }
              else if (iVar2 == 4) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructDMat4x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructDMat4x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructDMat4x4;
                }
              }
            }
            break;
          case 3:
            iVar2 = (*type->_vptr_TType[0xd])();
            if (iVar2 == 0) {
              iVar2 = (*type->_vptr_TType[0xc])();
              switch(iVar2) {
              case 1:
                local_24 = EOpConstructFloat16;
                break;
              case 2:
                local_24 = EOpConstructF16Vec2;
                break;
              case 3:
                local_24 = EOpConstructF16Vec3;
                break;
              case 4:
                local_24 = EOpConstructF16Vec4;
              }
            }
            else {
              iVar2 = (*type->_vptr_TType[0xd])();
              if (iVar2 == 2) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructF16Mat2x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructF16Mat2x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructF16Mat2x4;
                }
              }
              else if (iVar2 == 3) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructF16Mat3x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructF16Mat3x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructF16Mat3x4;
                }
              }
              else if (iVar2 == 4) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructF16Mat4x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructF16Mat4x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructF16Mat4x4;
                }
              }
            }
            break;
          case 4:
            iVar2 = (*type->_vptr_TType[0xc])();
            switch(iVar2) {
            case 1:
              local_24 = EOpConstructInt8;
              break;
            case 2:
              local_24 = EOpConstructI8Vec2;
              break;
            case 3:
              local_24 = EOpConstructI8Vec3;
              break;
            case 4:
              local_24 = EOpConstructI8Vec4;
            }
            break;
          case 5:
            iVar2 = (*type->_vptr_TType[0xc])();
            switch(iVar2) {
            case 1:
              local_24 = EOpConstructUint8;
              break;
            case 2:
              local_24 = EOpConstructU8Vec2;
              break;
            case 3:
              local_24 = EOpConstructU8Vec3;
              break;
            case 4:
              local_24 = EOpConstructU8Vec4;
            }
            break;
          case 6:
            iVar2 = (*type->_vptr_TType[0xc])();
            switch(iVar2) {
            case 1:
              local_24 = EOpConstructInt16;
              break;
            case 2:
              local_24 = EOpConstructI16Vec2;
              break;
            case 3:
              local_24 = EOpConstructI16Vec3;
              break;
            case 4:
              local_24 = EOpConstructI16Vec4;
            }
            break;
          case 7:
            iVar2 = (*type->_vptr_TType[0xc])();
            switch(iVar2) {
            case 1:
              local_24 = EOpConstructUint16;
              break;
            case 2:
              local_24 = EOpConstructU16Vec2;
              break;
            case 3:
              local_24 = EOpConstructU16Vec3;
              break;
            case 4:
              local_24 = EOpConstructU16Vec4;
            }
            break;
          case 8:
            iVar2 = (*type->_vptr_TType[0xd])();
            if (iVar2 == 0) {
              iVar2 = (*type->_vptr_TType[0xc])();
              switch(iVar2) {
              case 1:
                local_24 = EOpConstructInt;
                break;
              case 2:
                local_24 = EOpConstructIVec2;
                break;
              case 3:
                local_24 = EOpConstructIVec3;
                break;
              case 4:
                local_24 = EOpConstructIVec4;
              }
            }
            else {
              iVar2 = (*type->_vptr_TType[0xd])();
              if (iVar2 == 2) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructIMat2x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructIMat2x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructIMat2x4;
                }
              }
              else if (iVar2 == 3) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructIMat3x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructIMat3x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructIMat3x4;
                }
              }
              else if (iVar2 == 4) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructIMat4x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructIMat4x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructIMat4x4;
                }
              }
            }
            break;
          case 9:
            iVar2 = (*type->_vptr_TType[0xd])();
            if (iVar2 == 0) {
              iVar2 = (*type->_vptr_TType[0xc])();
              switch(iVar2) {
              case 1:
                local_24 = EOpConstructUint;
                break;
              case 2:
                local_24 = EOpConstructUVec2;
                break;
              case 3:
                local_24 = EOpConstructUVec3;
                break;
              case 4:
                local_24 = EOpConstructUVec4;
              }
            }
            else {
              iVar2 = (*type->_vptr_TType[0xd])();
              if (iVar2 == 2) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructUMat2x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructUMat2x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructUMat2x4;
                }
              }
              else if (iVar2 == 3) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructUMat3x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructUMat3x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructUMat3x4;
                }
              }
              else if (iVar2 == 4) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructUMat4x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructUMat4x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructUMat4x4;
                }
              }
            }
            break;
          case 10:
            iVar2 = (*type->_vptr_TType[0xc])();
            switch(iVar2) {
            case 1:
              local_24 = EOpConstructInt64;
              break;
            case 2:
              local_24 = EOpConstructI64Vec2;
              break;
            case 3:
              local_24 = EOpConstructI64Vec3;
              break;
            case 4:
              local_24 = EOpConstructI64Vec4;
            }
            break;
          case 0xb:
            iVar2 = (*type->_vptr_TType[0xc])();
            switch(iVar2) {
            case 1:
              local_24 = EOpConstructUint64;
              break;
            case 2:
              local_24 = EOpConstructU64Vec2;
              break;
            case 3:
              local_24 = EOpConstructU64Vec3;
              break;
            case 4:
              local_24 = EOpConstructU64Vec4;
            }
            break;
          case 0xc:
            iVar2 = (*type->_vptr_TType[0xd])();
            if (iVar2 == 0) {
              iVar2 = (*type->_vptr_TType[0xc])();
              switch(iVar2) {
              case 1:
                local_24 = EOpConstructBool;
                break;
              case 2:
                local_24 = EOpConstructBVec2;
                break;
              case 3:
                local_24 = EOpConstructBVec3;
                break;
              case 4:
                local_24 = EOpConstructBVec4;
              }
            }
            else {
              iVar2 = (*type->_vptr_TType[0xd])();
              if (iVar2 == 2) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructBMat2x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructBMat2x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructBMat2x4;
                }
              }
              else if (iVar2 == 3) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructBMat3x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructBMat3x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructBMat3x4;
                }
              }
              else if (iVar2 == 4) {
                iVar2 = (*type->_vptr_TType[0xe])();
                if (iVar2 == 2) {
                  local_24 = EOpConstructBMat4x2;
                }
                else if (iVar2 == 3) {
                  local_24 = EOpConstructBMat4x3;
                }
                else if (iVar2 == 4) {
                  local_24 = EOpConstructBMat4x4;
                }
              }
            }
            break;
          default:
            break;
          case 0xe:
            iVar2 = (*type->_vptr_TType[8])();
            bVar1 = TSampler::isCombined((TSampler *)CONCAT44(extraout_var_00,iVar2));
            if (bVar1) {
              local_24 = EOpConstructTextureSampler;
            }
            break;
          case 0xf:
            local_24 = EOpConstructStruct;
            break;
          case 0x11:
            local_24 = EOpConstructAccStruct;
            break;
          case 0x12:
            local_24 = EOpConstructReference;
          }
          this_local._4_4_ = local_24;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

TOperator TIntermediate::mapTypeToConstructorOp(const TType& type) const
{
    TOperator op = EOpNull;

    if (type.getQualifier().isNonUniform())
        return EOpConstructNonuniform;

    if (type.isCoopMatNV())
        return EOpConstructCooperativeMatrixNV;

    if (type.isCoopMatKHR())
        return EOpConstructCooperativeMatrixKHR;

    if (type.isCoopVecNV())
        return EOpConstructCooperativeVectorNV;

    switch (type.getBasicType()) {
    case EbtStruct:
        op = EOpConstructStruct;
        break;
    case EbtSampler:
        if (type.getSampler().isCombined())
            op = EOpConstructTextureSampler;
        break;
    case EbtFloat:
        if (type.isMatrix()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructMat2x2; break;
                case 3: op = EOpConstructMat2x3; break;
                case 4: op = EOpConstructMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructMat3x2; break;
                case 3: op = EOpConstructMat3x3; break;
                case 4: op = EOpConstructMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructMat4x2; break;
                case 3: op = EOpConstructMat4x3; break;
                case 4: op = EOpConstructMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            default: break; // some compilers want this
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructFloat; break;
            case 2: op = EOpConstructVec2;  break;
            case 3: op = EOpConstructVec3;  break;
            case 4: op = EOpConstructVec4;  break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtInt:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructIMat2x2; break;
                case 3: op = EOpConstructIMat2x3; break;
                case 4: op = EOpConstructIMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructIMat3x2; break;
                case 3: op = EOpConstructIMat3x3; break;
                case 4: op = EOpConstructIMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructIMat4x2; break;
                case 3: op = EOpConstructIMat4x3; break;
                case 4: op = EOpConstructIMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructInt;   break;
            case 2: op = EOpConstructIVec2; break;
            case 3: op = EOpConstructIVec3; break;
            case 4: op = EOpConstructIVec4; break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtUint:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructUMat2x2; break;
                case 3: op = EOpConstructUMat2x3; break;
                case 4: op = EOpConstructUMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructUMat3x2; break;
                case 3: op = EOpConstructUMat3x3; break;
                case 4: op = EOpConstructUMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructUMat4x2; break;
                case 3: op = EOpConstructUMat4x3; break;
                case 4: op = EOpConstructUMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructUint;  break;
            case 2: op = EOpConstructUVec2; break;
            case 3: op = EOpConstructUVec3; break;
            case 4: op = EOpConstructUVec4; break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtBool:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructBMat2x2; break;
                case 3: op = EOpConstructBMat2x3; break;
                case 4: op = EOpConstructBMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructBMat3x2; break;
                case 3: op = EOpConstructBMat3x3; break;
                case 4: op = EOpConstructBMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructBMat4x2; break;
                case 3: op = EOpConstructBMat4x3; break;
                case 4: op = EOpConstructBMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1:  op = EOpConstructBool;  break;
            case 2:  op = EOpConstructBVec2; break;
            case 3:  op = EOpConstructBVec3; break;
            case 4:  op = EOpConstructBVec4; break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtDouble:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructDMat2x2; break;
                case 3: op = EOpConstructDMat2x3; break;
                case 4: op = EOpConstructDMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructDMat3x2; break;
                case 3: op = EOpConstructDMat3x3; break;
                case 4: op = EOpConstructDMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructDMat4x2; break;
                case 3: op = EOpConstructDMat4x3; break;
                case 4: op = EOpConstructDMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructDouble; break;
            case 2: op = EOpConstructDVec2;  break;
            case 3: op = EOpConstructDVec3;  break;
            case 4: op = EOpConstructDVec4;  break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtFloat16:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructF16Mat2x2; break;
                case 3: op = EOpConstructF16Mat2x3; break;
                case 4: op = EOpConstructF16Mat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructF16Mat3x2; break;
                case 3: op = EOpConstructF16Mat3x3; break;
                case 4: op = EOpConstructF16Mat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructF16Mat4x2; break;
                case 3: op = EOpConstructF16Mat4x3; break;
                case 4: op = EOpConstructF16Mat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        }
        else {
            switch (type.getVectorSize()) {
            case 1: op = EOpConstructFloat16;  break;
            case 2: op = EOpConstructF16Vec2;  break;
            case 3: op = EOpConstructF16Vec3;  break;
            case 4: op = EOpConstructF16Vec4;  break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtInt8:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructInt8;   break;
        case 2: op = EOpConstructI8Vec2; break;
        case 3: op = EOpConstructI8Vec3; break;
        case 4: op = EOpConstructI8Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtUint8:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructUint8;  break;
        case 2: op = EOpConstructU8Vec2; break;
        case 3: op = EOpConstructU8Vec3; break;
        case 4: op = EOpConstructU8Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtInt16:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructInt16;   break;
        case 2: op = EOpConstructI16Vec2; break;
        case 3: op = EOpConstructI16Vec3; break;
        case 4: op = EOpConstructI16Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtUint16:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructUint16;  break;
        case 2: op = EOpConstructU16Vec2; break;
        case 3: op = EOpConstructU16Vec3; break;
        case 4: op = EOpConstructU16Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtInt64:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructInt64;   break;
        case 2: op = EOpConstructI64Vec2; break;
        case 3: op = EOpConstructI64Vec3; break;
        case 4: op = EOpConstructI64Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtUint64:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructUint64;  break;
        case 2: op = EOpConstructU64Vec2; break;
        case 3: op = EOpConstructU64Vec3; break;
        case 4: op = EOpConstructU64Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtReference:
        op = EOpConstructReference;
        break;

    case EbtAccStruct:
        op = EOpConstructAccStruct;
        break;
    default:
        break;
    }

    return op;
}